

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::TSPI_PDU::SetMeasuredSpeed(TSPI_PDU *this,KFIXED16_3 *S)

{
  DataTypeBase local_30;
  short local_28;
  KFIXED<short,_(unsigned_char)__x03_> local_20;
  
  SetMeasuredSpeedFlag(this,true);
  local_30._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_0021d1a0;
  local_28 = S->m_Val;
  DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::operator=(&local_20,&this->m_MeasureSpd);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_20.super_DataTypeBase);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_30);
  return;
}

Assistant:

void TSPI_PDU::SetMeasuredSpeed( KFIXED16_3 S )
{
    SetMeasuredSpeedFlag( true );
    m_MeasureSpd = S;
}